

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bus.h
# Opt level: O0

void __thiscall Bus::Bus(Bus *this)

{
  value_type_conflict2 local_1d [13];
  Bus *local_10;
  Bus *this_local;
  
  local_10 = this;
  m6502::m6502(&this->cpu);
  m2C02::m2C02(&this->ppu);
  this->nSystemClockCounter = 0;
  std::shared_ptr<Catridge>::shared_ptr(&this->cart,(nullptr_t)0x0);
  local_1d[0] = '\0';
  std::array<unsigned_char,_2048UL>::fill(&this->cpuRam,local_1d);
  m6502::ConnectBus(&this->cpu,this);
  return;
}

Assistant:

Bus()
  {
    cpuRam.fill(0);
    cpu.ConnectBus(this);
  }